

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationTest.cpp
# Opt level: O2

void __thiscall ninx_evaluation::test_multiline_comment::test_method(test_multiline_comment *this)

{
  allocator local_81;
  undefined1 local_80 [24];
  char *local_68;
  string output;
  char *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  
  std::__cxx11::string::string
            ((string *)local_80,"\nFirst\n/*\nMultiple comment\nlines\n*/\nSecond\n",&local_81);
  eval(&output,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::locale::locale((locale *)local_80);
  boost::algorithm::trim<std::__cxx11::string>(&output,(locale *)local_80);
  std::locale::~locale((locale *)local_80);
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/evaluation/EvaluationTest.cpp"
  ;
  local_18 = "";
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_28 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x1a0);
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_001feb80;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/evaluation/EvaluationTest.cpp"
  ;
  local_38 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_80,&local_40,0x1a0,1,2,&output,"output","First\nSecond","\"First\\nSecond\"");
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_multiline_comment) {
        auto output{eval(
                R"NINX(
First
/*
Multiple comment
lines
*/
Second
)NINX"
        )};

        boost::trim(output);

        BOOST_CHECK_EQUAL(output, "First\nSecond");  // Notice the space between
    }